

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_mem(char **strp,lyd_node *root,LYD_FORMAT format,int options)

{
  undefined1 local_68 [4];
  int r;
  lyout out;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  char **strp_local;
  
  out.hole_count._0_4_ = options;
  out.hole_count._4_4_ = format;
  if (strp == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_mem");
    strp_local._4_4_ = 1;
  }
  else {
    memset(local_68,0,0x40);
    local_68 = (undefined1  [4])0x2;
    strp_local._4_4_ = lyd_print_((lyout *)local_68,root,out.hole_count._4_4_,(int)out.hole_count);
    *strp = (char *)out._0_8_;
    free((void *)out.method.mem.size);
  }
  return strp_local._4_4_;
}

Assistant:

API int
lyd_print_mem(char **strp, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    struct lyout out;
    int r;

    if (!strp) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_MEMORY;

    r = lyd_print_(&out, root, format, options);

    *strp = out.method.mem.buf;
    free(out.buffered);
    return r;
}